

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::process_pending_clients(Server *this)

{
  bool bVar1;
  runtime_error *this_00;
  SOCK5ConnectionMaker *this_01;
  SOCK5ConnectionMaker *local_78;
  pair<int,_SOCK5ConnectionMaker_*> local_70;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  int local_28 [2];
  int client_connection;
  socklen_t addrlen;
  sockaddr_in client_addr;
  Server *this_local;
  
  if (((this->rdfds).fds_bits[this->listen_sockfd / 0x40] &
      1L << ((byte)((long)this->listen_sockfd % 0x40) & 0x3f)) != 0) {
    local_28[1] = 0x10;
    client_addr.sin_zero = (uchar  [8])this;
    local_28[0] = accept(this->listen_sockfd,(sockaddr *)&client_connection,
                         (socklen_t *)(local_28 + 1));
    bVar1 = add_fd(this,local_28[0]);
    if (!bVar1) {
      local_5d = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Socket number out of range for select",&local_49);
      std::runtime_error::runtime_error(this_00,local_48);
      local_5d = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (SOCK5ConnectionMaker *)operator_new(0x840);
    SOCK5ConnectionMaker::SOCK5ConnectionMaker(this_01,local_28[0]);
    local_78 = this_01;
    std::pair<int,_SOCK5ConnectionMaker_*>::pair<int_&,_SOCK5ConnectionMaker_*,_true>
              (&local_70,local_28,&local_78);
    std::__cxx11::
    list<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
    ::push_back(&this->waitingForHandshake,&local_70);
  }
  return;
}

Assistant:

void Server::process_pending_clients() {
    if (FD_ISSET(listen_sockfd, &rdfds)) {
        sockaddr_in client_addr;
        socklen_t addrlen = sizeof(client_addr);
        int client_connection = accept(listen_sockfd, reinterpret_cast<sockaddr *>(&client_addr), &addrlen);
        if (!add_fd(client_connection)) {
            throw std::runtime_error(std::string("Socket number out of range for select"));
        }
        waitingForHandshake.push_back(std::pair<int, SOCK5ConnectionMaker*>(client_connection,new SOCK5ConnectionMaker(client_connection)));
    }
}